

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCachePop(Parse *pParse)

{
  uint i;
  ulong uVar1;
  
  pParse->iCacheLevel = pParse->iCacheLevel + -1;
  uVar1 = 0;
  do {
    i = (uint)uVar1;
    while( true ) {
      if (pParse->nColCache <= i) {
        return;
      }
      if (pParse->aColCache[uVar1].iLevel <= pParse->iCacheLevel) break;
      cacheEntryClear(pParse,i);
    }
    uVar1 = (ulong)(i + 1);
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCachePop(Parse *pParse){
  int i = 0;
  assert( pParse->iCacheLevel>=1 );
  pParse->iCacheLevel--;
#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("POP  to %d\n", pParse->iCacheLevel);
  }
#endif
  while( i<pParse->nColCache ){
    if( pParse->aColCache[i].iLevel>pParse->iCacheLevel ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}